

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::NewFunction
          (ByteCodeWriter *this,RegSlot destinationRegister,uint index,bool isGenerator,
          RegSlot homeObjLocation)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value;
  RegSlot instance;
  undefined4 *puVar3;
  bool bVar4;
  OpCode local_24;
  bool success_1;
  bool success;
  OpCode opcode;
  bool hasHomeObj;
  RegSlot homeObjLocation_local;
  bool isGenerator_local;
  uint index_local;
  RegSlot destinationRegister_local;
  ByteCodeWriter *this_local;
  
  CheckOpen(this);
  bVar4 = homeObjLocation != 0xffffffff;
  value = ConsumeReg(this,destinationRegister);
  local_24 = NewScFunc;
  if (isGenerator) {
    local_24 = NewScGenFunc;
    if (bVar4) {
      local_24 = NewScGenFuncHomeObj;
    }
  }
  else {
    bVar2 = ParseableFunctionInfo::DoStackNestedFunc
                      (&this->m_functionWrite->super_ParseableFunctionInfo);
    if (bVar2) {
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x911,"(!hasHomeObj)","!hasHomeObj");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      local_24 = NewStackScFunc;
    }
    else if (bVar4) {
      local_24 = NewScFuncHomeObj;
    }
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_24);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x918,"(OpCodeAttr::HasMultiSizeLayout(opcode))",
                                "OpCodeAttr::HasMultiSizeLayout(opcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (bVar4) {
    instance = ConsumeReg(this,homeObjLocation);
    bVar4 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,local_24,value,instance,index);
    if (((!bVar4) &&
        (bVar4 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,local_24,value,instance,index), !bVar4)) &&
       (bVar4 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,local_24,value,instance,index), !bVar4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x91d,"(success)","success");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    bVar4 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,local_24,value,index);
    if (((!bVar4) &&
        (bVar4 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,local_24,value,index), !bVar4)) &&
       (bVar4 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,local_24,value,index), !bVar4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x921,"(success)","success");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::NewFunction(RegSlot destinationRegister, uint index, bool isGenerator, RegSlot homeObjLocation)
    {
        CheckOpen();

        bool hasHomeObj = homeObjLocation != Js::Constants::NoRegister;
        destinationRegister = ConsumeReg(destinationRegister);
        OpCode opcode = OpCode::NewScFunc;
        if (isGenerator)
        {
            opcode = hasHomeObj ? OpCode::NewScGenFuncHomeObj : OpCode::NewScGenFunc;
        }
        else if (this->m_functionWrite->DoStackNestedFunc())
        {
            Assert(!hasHomeObj);
            opcode = OpCode::NewStackScFunc;
        }
        else if (hasHomeObj)
        {
            opcode = OpCode::NewScFuncHomeObj;
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(opcode));

        if (hasHomeObj)
        {
            homeObjLocation = ConsumeReg(homeObjLocation);
            MULTISIZE_LAYOUT_WRITE(ElementSlot, opcode, destinationRegister, homeObjLocation, index);
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(ElementSlotI1, opcode, destinationRegister, index);
        }
    }